

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall TPZMatrix<long>::Transpose(TPZMatrix<long> *this,TPZMatrix<long> *T)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  int iVar5;
  int64_t iVar6;
  int64_t iVar7;
  undefined4 extraout_var;
  long *in_RSI;
  TPZBaseMatrix *in_RDI;
  int64_t c;
  int64_t r;
  undefined8 local_28;
  long local_20;
  long local_18;
  long *local_10;
  
  local_10 = in_RSI;
  iVar6 = TPZBaseMatrix::Cols(in_RDI);
  iVar7 = TPZBaseMatrix::Rows(in_RDI);
  (**(code **)(*in_RSI + 0x68))(in_RSI,iVar6,iVar7);
  local_18 = 0;
  while( true ) {
    lVar1 = local_18;
    iVar6 = TPZBaseMatrix::Rows(in_RDI);
    if (iVar6 <= lVar1) break;
    local_20 = 0;
    while( true ) {
      lVar1 = local_20;
      iVar6 = TPZBaseMatrix::Cols(in_RDI);
      plVar4 = local_10;
      lVar3 = local_18;
      lVar2 = local_20;
      if (iVar6 <= lVar1) break;
      iVar5 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_18,local_20);
      local_28 = CONCAT44(extraout_var,iVar5);
      (**(code **)(*plVar4 + 0x118))(plVar4,lVar2,lVar3,&local_28);
      local_20 = local_20 + 1;
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Transpose(TPZMatrix<TVar> *T) const {
	T->Resize( Cols(), Rows() );
	
	for ( int64_t r = 0; r < Rows(); r++ ) {
        for ( int64_t c = 0; c < Cols(); c++ ) {
            T->PutVal( c, r, GetVal( r, c ) );
        }
    }
}